

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvm.inc.c
# Opt level: O3

_Bool trans_mulh(DisasContext_conflict12 *ctx,arg_mulh *a)

{
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGv_i64 a2;
  int *in_RDX;
  uintptr_t o_4;
  TCGOpcode TVar2;
  uintptr_t o_3;
  TCGv_i64 rh;
  
  if (((uint)ctx >> 0xc & 1) == 0) goto LAB_00c6e263;
  a1 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)a,TCG_TYPE_I64,false);
  rh = (TCGv_i64)((long)a1 - (long)a);
  a1_00 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)a,TCG_TYPE_I64,false);
  if ((long)in_RDX[1] == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00c6e1c2:
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)a,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (*(TCGv_i64 *)(&a[0xba6].rs2 + (long)in_RDX[1] * 2) != rh) {
    pTVar1 = *(TCGv_i64 *)(&a[0xba6].rs2 + (long)in_RDX[1] * 2) + (long)a;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c6e1c2;
  }
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)a);
  if ((long)in_RDX[2] == 0) {
    TVar2 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_00c6e204:
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)a,TVar2,(TCGArg)a1_00,(TCGArg)a2);
  }
  else if (*(TCGv_i64 *)(&a[0xba6].rs2 + (long)in_RDX[2] * 2) != pTVar1) {
    a2 = *(TCGv_i64 *)(&a[0xba6].rs2 + (long)in_RDX[2] * 2) + (long)a;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c6e204;
  }
  tcg_gen_muls2_i64_riscv64((TCGContext_conflict11 *)a,pTVar1,rh,rh,pTVar1);
  if (((long)*in_RDX != 0) && (*(TCGv_i64 *)(&a[0xba6].rs2 + (long)*in_RDX * 2) != rh)) {
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)a,INDEX_op_mov_i64,
                        (TCGArg)(*(TCGv_i64 *)(&a[0xba6].rs2 + (long)*in_RDX * 2) + (long)a),
                        (TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)a,(TCGTemp *)(rh + (long)a));
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)a,(TCGTemp *)(pTVar1 + (long)a));
LAB_00c6e263:
  return (_Bool)((byte)((ulong)ctx >> 0xc) & 1);
}

Assistant:

static bool trans_mulh(DisasContext *ctx, arg_mulh *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    REQUIRE_EXT(ctx, RVM);
    TCGv source1 = tcg_temp_new(tcg_ctx);
    TCGv source2 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, source1, a->rs1);
    gen_get_gpr(tcg_ctx, source2, a->rs2);

    tcg_gen_muls2_tl(tcg_ctx, source2, source1, source1, source2);

    gen_set_gpr(tcg_ctx, a->rd, source1);
    tcg_temp_free(tcg_ctx, source1);
    tcg_temp_free(tcg_ctx, source2);
    return true;
}